

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O1

void mpmc_pointer_basics<int*,4ul>(void)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  atomic<unsigned_long> *paVar4;
  __atomic_base<unsigned_long> _Var5;
  __atomic_base<unsigned_long> _Var6;
  __int_type_conflict1 _Var7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  ResultBuilder DOCTEST_RB;
  size_t N;
  MPMC<int_*,_4UL> mpmc;
  Result local_3c8;
  ResultBuilder local_3a8;
  int *local_330;
  Expression_lhs<const_unsigned_long> local_328;
  unsigned_long local_318;
  int *local_310;
  MPMC<int_*,_4UL> local_300;
  
  paVar4 = &local_300._buffer._M_elems[0].sequence;
  _Var7 = 0;
  do {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = _Var7;
    _Var7 = _Var7 + 1;
    paVar4 = paVar4 + 2;
  } while (_Var7 != 0x10);
  local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_318 = 0x10;
  local_310 = (int *)operator_new(0x44);
  local_310[0] = 0;
  local_310[1] = 0;
  local_310[2] = 0;
  local_310[3] = 0;
  local_310[4] = 0;
  local_310[5] = 0;
  local_310[6] = 0;
  local_310[7] = 0;
  local_310[8] = 0;
  local_310[9] = 0;
  local_310[10] = 0;
  local_310[0xb] = 0;
  local_310[0xc] = 0;
  local_310[0xd] = 0;
  local_310[0xe] = 0;
  local_310[0xf] = 0;
  local_310[0x10] = 0;
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x253;
  local_3a8.super_AssertData.m_expr = "mpmc.capacity() == N";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs = 0x10;
  local_328.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_3c8,&local_328,&local_318);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da;
  uVar12 = extraout_XMM0_Db;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_00;
    uVar12 = extraout_XMM0_Db_00;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x255;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs =
       0xc00000001 -
       (ulong)((ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i <
              (ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i);
  local_330 = (int *)CONCAT71(local_330._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_01;
  uVar12 = extraout_XMM0_Db_01;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_02;
    uVar12 = extraout_XMM0_Db_02;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x256;
  local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
  local_328.m_at = DT_REQUIRE;
  local_330 = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3c8,(Expression_lhs<int*const> *)&local_328,&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_03;
  uVar12 = extraout_XMM0_Db_03;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_04;
    uVar12 = extraout_XMM0_Db_04;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_318 != 0) {
    uVar10 = 0;
    piVar9 = local_310;
    do {
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x259;
      local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[i]) == true";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      bVar3 = tf::MPMC<int_*,_4UL>::try_enqueue(&local_300,piVar9);
      local_328.lhs = (ulong)bVar3 | 0xc00000000;
      local_330 = (int *)CONCAT71(local_330._1_7_,1);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar11 = extraout_XMM0_Da_05;
      uVar12 = extraout_XMM0_Db_05;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar11 = extraout_XMM0_Da_06;
        uVar12 = extraout_XMM0_Db_06;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar10 = uVar10 + 1;
      piVar9 = piVar9 + 1;
    } while (uVar10 < local_318);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x25c;
  local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  bVar3 = tf::MPMC<int_*,_4UL>::try_enqueue(&local_300,local_310 + local_318);
  local_328.lhs = (ulong)bVar3 | 0xc00000000;
  local_330 = (int *)((ulong)local_330 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_07;
  uVar12 = extraout_XMM0_Db_07;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_08;
    uVar12 = extraout_XMM0_Db_08;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x25d;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_330 = (int *)((ulong)local_330 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_09;
  uVar12 = extraout_XMM0_Db_09;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_10;
    uVar12 = extraout_XMM0_Db_10;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_318 != 0) {
    uVar10 = 0;
    piVar9 = local_310;
    do {
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x260;
      local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      local_328.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
      local_328.m_at = DT_REQUIRE;
      local_330 = piVar9;
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_3c8,(Expression_lhs<int*const> *)&local_328,&local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar11 = extraout_XMM0_Da_11;
      uVar12 = extraout_XMM0_Db_11;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar11 = extraout_XMM0_Da_12;
        uVar12 = extraout_XMM0_Db_12;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar10 = uVar10 + 1;
      piVar9 = piVar9 + 1;
    } while (uVar10 < local_318);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x263;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_330 = (int *)CONCAT71(local_330._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_13;
  uVar12 = extraout_XMM0_Db_13;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_14;
    uVar12 = extraout_XMM0_Db_14;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x264;
  local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_328.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
  local_328.m_at = DT_REQUIRE;
  local_330 = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3c8,(Expression_lhs<int*const> *)&local_328,&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_15;
  uVar12 = extraout_XMM0_Db_15;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_16;
    uVar12 = extraout_XMM0_Db_16;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_318 != 0) {
    uVar10 = 0;
    _Var5 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
    do {
      do {
        uVar8 = (ulong)(((uint)_Var5._M_i & 0xf) << 4);
        _Var6 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
        if (*(ulong *)((long)&local_300._buffer._M_elems[0].sequence.
                              super___atomic_base<unsigned_long>._M_i + uVar8) == _Var5._M_i) {
          LOCK();
          bVar3 = (__atomic_base<unsigned_long>)_Var5._M_i ==
                  local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
          if (bVar3) {
            local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)(_Var5._M_i + 1);
            _Var6._M_i = _Var5._M_i;
          }
          UNLOCK();
          bVar3 = !bVar3;
        }
        else {
          bVar3 = true;
        }
        _Var5._M_i = _Var6._M_i;
      } while (bVar3);
      *(int **)((long)&local_300._buffer._M_elems[0].data + uVar8) = local_310 + uVar10;
      *(__int_type_conflict1 *)
       ((long)&local_300._buffer._M_elems[0].sequence.super___atomic_base<unsigned_long>._M_i +
       uVar8) = _Var6._M_i + 1;
      uVar10 = uVar10 + 1;
      _Var5 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
    } while (uVar10 < local_318);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x269;
  local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  bVar3 = tf::MPMC<int_*,_4UL>::try_enqueue(&local_300,local_310 + local_318);
  local_328.lhs = (ulong)bVar3 | 0xc00000000;
  local_330 = (int *)((ulong)local_330 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_17;
  uVar12 = extraout_XMM0_Db_17;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_18;
    uVar12 = extraout_XMM0_Db_18;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_08 == '\0') {
    if ((local_3a8.super_AssertData.m_failed == true) &&
       (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
      doctest::detail::throwException();
    }
    if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                         local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                         local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                         local_3a8.super_AssertData.m_exception.field_0.buf[0]));
    }
    if (local_318 != 0) {
      uVar10 = 0;
      piVar9 = local_310;
      do {
        local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_3a8.super_AssertData.m_at = DT_REQUIRE;
        local_3a8.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
        ;
        local_3a8.super_AssertData.m_line = 0x26c;
        local_3a8.super_AssertData.m_expr = "mpmc.empty() == false";
        local_3a8.super_AssertData.m_failed = true;
        local_3a8.super_AssertData.m_threw = false;
        local_3a8.super_AssertData.m_threw_as = false;
        local_3a8.super_AssertData.m_exception_type = "";
        local_3a8.super_AssertData.m_exception_string = "";
        local_328.lhs =
             (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                    (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) |
             0xc00000000;
        local_330 = (int *)((ulong)local_330 & 0xffffffffffffff00);
        doctest::detail::Expression_lhs<bool_const>::operator==
                  (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
        doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
        local_3a8.super_AssertData._40_2_ =
             CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_19;
        uVar12 = extraout_XMM0_Db_19;
        if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_20;
          uVar12 = extraout_XMM0_Db_20;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_09 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        if ((local_3a8.super_AssertData.m_failed == true) &&
           (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
          doctest::detail::throwException();
        }
        if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                             local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                             local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                             local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                             local_3a8.super_AssertData.m_exception.field_0.buf[0]))
          ;
        }
        local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_3a8.super_AssertData.m_at = DT_REQUIRE;
        local_3a8.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
        ;
        local_3a8.super_AssertData.m_line = 0x26d;
        local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
        local_3a8.super_AssertData.m_failed = true;
        local_3a8.super_AssertData.m_threw = false;
        local_3a8.super_AssertData.m_threw_as = false;
        local_3a8.super_AssertData.m_exception_type = "";
        local_3a8.super_AssertData.m_exception_string = "";
        local_328.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
        local_328.m_at = DT_REQUIRE;
        local_330 = piVar9;
        doctest::detail::Expression_lhs<int*const>::operator==
                  (&local_3c8,(Expression_lhs<int*const> *)&local_328,&local_330);
        doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
        local_3a8.super_AssertData._40_2_ =
             CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_21;
        uVar12 = extraout_XMM0_Db_21;
        if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_22;
          uVar12 = extraout_XMM0_Db_22;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_10 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        if ((local_3a8.super_AssertData.m_failed == true) &&
           (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
          doctest::detail::throwException();
        }
        if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                             local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                             local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                             local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                             local_3a8.super_AssertData.m_exception.field_0.buf[0]))
          ;
        }
        uVar10 = uVar10 + 1;
        piVar9 = piVar9 + 1;
      } while (uVar10 < local_318);
    }
    local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3a8.super_AssertData.m_at = DT_REQUIRE;
    local_3a8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3a8.super_AssertData.m_line = 0x270;
    local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
    local_3a8.super_AssertData.m_failed = true;
    local_3a8.super_AssertData.m_threw = false;
    local_3a8.super_AssertData.m_threw_as = false;
    local_3a8.super_AssertData.m_exception_type = "";
    local_3a8.super_AssertData.m_exception_string = "";
    local_328.lhs =
         (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000
    ;
    local_330 = (int *)CONCAT71(local_330._1_7_,1);
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_3c8,(Expression_lhs<bool_const> *)&local_328,(bool *)&local_330);
    doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
    local_3a8.super_AssertData._40_2_ =
         CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
    uVar11 = extraout_XMM0_Da_23;
    uVar12 = extraout_XMM0_Db_23;
    if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
      uVar11 = extraout_XMM0_Da_24;
      uVar12 = extraout_XMM0_Db_24;
    }
    dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
    if (extraout_AL_11 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if ((local_3a8.super_AssertData.m_failed == true) &&
       (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
      doctest::detail::throwException();
    }
    if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                         local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                         local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                         local_3a8.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3a8.super_AssertData.m_at = DT_REQUIRE;
    local_3a8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3a8.super_AssertData.m_line = 0x271;
    local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
    local_3a8.super_AssertData.m_failed = true;
    local_3a8.super_AssertData.m_threw = false;
    local_3a8.super_AssertData.m_threw_as = false;
    local_3a8.super_AssertData.m_exception_type = "";
    local_3a8.super_AssertData.m_exception_string = "";
    local_328.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
    local_328.m_at = DT_REQUIRE;
    local_330 = (int *)0x0;
    doctest::detail::Expression_lhs<int*const>::operator==
              (&local_3c8,(Expression_lhs<int*const> *)&local_328,&local_330);
    doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
    local_3a8.super_AssertData._40_2_ =
         CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
    uVar11 = extraout_XMM0_Da_25;
    uVar12 = extraout_XMM0_Db_25;
    if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
      uVar11 = extraout_XMM0_Da_26;
      uVar12 = extraout_XMM0_Db_26;
    }
    dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar12,uVar11));
    if (extraout_AL_12 == '\0') {
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      operator_delete(local_310,0x44);
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}